

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

string * __thiscall CNetAddr::ToStringAddr_abi_cxx11_(string *__return_storage_ptr__,CNetAddr *this)

{
  uint uVar1;
  long lVar2;
  uint32_t scope_id;
  uint uVar3;
  long in_FS_OFFSET;
  Span<const_unsigned_char> input;
  Span<const_unsigned_char> addr;
  Span<const_unsigned_char> a;
  Span<const_unsigned_char> input_00;
  _Alloc_hider in_stack_ffffffffffffffc8;
  CNetAddr *pCVar4;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->m_net) {
  case NET_UNROUTABLE:
  case NET_MAX:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                  ,0x259,"std::string CNetAddr::ToStringAddr() const");
  case NET_IPV4:
    if (0x10 < (this->m_addr)._size) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      tinyformat::format<unsigned_char,unsigned_char,unsigned_char,unsigned_char>
                (__return_storage_ptr__,(tinyformat *)"%u.%u.%u.%u",(char *)this,
                 (uchar *)((this->m_addr)._union.direct + 1),
                 (uchar *)((this->m_addr)._union.direct + 2),
                 (uchar *)((this->m_addr)._union.direct + 3),(uchar *)in_stack_ffffffffffffffc8._M_p
                );
      return __return_storage_ptr__;
    }
    break;
  case NET_IPV6:
    uVar1 = (this->m_addr)._size;
    scope_id = this->m_scope_id;
    uVar3 = uVar1 - 0x11;
    pCVar4 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
      pCVar4 = this;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
LAB_00596a6b:
      a.m_size._0_4_ = uVar3;
      a.m_data = (uchar *)pCVar4;
      a.m_size._4_4_ = 0;
      IPv6ToString_abi_cxx11_(__return_storage_ptr__,a,scope_id);
      return __return_storage_ptr__;
    }
    break;
  case NET_ONION:
    uVar1 = (this->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    pCVar4 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
      pCVar4 = this;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      addr.m_size._0_4_ = uVar3;
      addr.m_data = (uchar *)pCVar4;
      addr.m_size._4_4_ = 0;
      OnionToString_abi_cxx11_(__return_storage_ptr__,addr);
      return __return_storage_ptr__;
    }
    break;
  case NET_I2P:
    uVar1 = (this->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    pCVar4 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
      pCVar4 = this;
    }
    input_00.m_size._0_4_ = uVar3;
    input_00.m_data = (uchar *)pCVar4;
    input_00.m_size._4_4_ = 0;
    EncodeBase32_abi_cxx11_((string *)&stack0xffffffffffffffc8,input_00,false);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffc8,".b32.i2p");
    goto LAB_00596aa3;
  case NET_CJDNS:
    uVar1 = (this->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    pCVar4 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
      pCVar4 = this;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      scope_id = 0;
      goto LAB_00596a6b;
    }
    break;
  case NET_INTERNAL:
    uVar1 = (this->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    pCVar4 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
      pCVar4 = this;
    }
    input.m_size._0_4_ = uVar3;
    input.m_data = (uchar *)pCVar4;
    input.m_size._4_4_ = 0;
    EncodeBase32_abi_cxx11_((string *)&stack0xffffffffffffffc8,input,true);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffc8,".internal");
LAB_00596aa3:
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return __return_storage_ptr__;
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                  ,0x25c,"std::string CNetAddr::ToStringAddr() const");
  }
  __stack_chk_fail();
}

Assistant:

std::string CNetAddr::ToStringAddr() const
{
    switch (m_net) {
    case NET_IPV4:
        return IPv4ToString(m_addr);
    case NET_IPV6:
        return IPv6ToString(m_addr, m_scope_id);
    case NET_ONION:
        return OnionToString(m_addr);
    case NET_I2P:
        return EncodeBase32(m_addr, false /* don't pad with = */) + ".b32.i2p";
    case NET_CJDNS:
        return IPv6ToString(m_addr, 0);
    case NET_INTERNAL:
        return EncodeBase32(m_addr) + ".internal";
    case NET_UNROUTABLE: // m_net is never and should not be set to NET_UNROUTABLE
    case NET_MAX:        // m_net is never and should not be set to NET_MAX
        assert(false);
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}